

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::processFunction
          (RemoveUnusedInterfaceVariablesContext *this,Function *func)

{
  BasicBlock *pBVar1;
  pointer pOVar2;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var3;
  bool bVar4;
  char cVar5;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var6;
  pointer pOVar7;
  Instruction *pIVar8;
  RemoveUnusedInterfaceVariablesContext **local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  RemoveUnusedInterfaceVariablesContext *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  pointer local_50;
  pointer local_48;
  RemoveUnusedInterfaceVariablesContext *local_40;
  undefined8 local_38;
  
  local_48 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48 != local_50) {
    local_40 = this;
    do {
      pBVar1 = (local_48->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar8 = *(Instruction **)
                     ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                     );
          pIVar8 != (Instruction *)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        uStack_70 = 0;
        local_78 = local_40;
        pcStack_60 = std::
                     _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/remove_unused_interface_variables_pass.cpp:33:33)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/remove_unused_interface_variables_pass.cpp:33:33)>
                   ::_M_manager;
        uStack_90 = 0;
        local_98 = &local_78;
        pcStack_80 = std::
                     _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
                   ::_M_manager;
        pOVar2 = *(pointer *)
                  ((long)&(pIVar8->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  + 8);
        for (pOVar7 = *(pointer *)
                       &(pIVar8->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl; pOVar7 != pOVar2; pOVar7 = pOVar7 + 1) {
          bVar4 = spvIsInIdType(pOVar7->type);
          if (bVar4) {
            _Var3._M_head_impl =
                 *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                  &(pOVar7->words).large_data_._M_t.
                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ;
            _Var6._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&(pOVar7->words).small_data_
            ;
            if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )_Var3._M_head_impl !=
                (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
                0x0) {
              _Var6._M_head_impl = _Var3._M_head_impl;
            }
            local_38 = *(undefined8 *)_Var6._M_head_impl;
            if (local_88 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar5 = (*pcStack_80)(&local_98,&local_38);
            if (cVar5 == '\0') break;
          }
        }
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,3);
        }
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,3);
        }
      }
      local_48 = local_48 + 1;
    } while (local_48 != local_50);
  }
  return false;
}

Assistant:

bool processFunction(Function* func) {
    for (const auto& basic_block : *func)
      for (const auto& instruction : basic_block)
        instruction.ForEachInId([&](const uint32_t* id) {
          if (used_variables_.count(*id)) return;
          auto* var = parent_.get_def_use_mgr()->GetDef(*id);
          if (!var || var->opcode() != spv::Op::OpVariable) return;
          auto storage_class =
              spv::StorageClass(var->GetSingleWordInOperand(0));
          if (storage_class != spv::StorageClass::Function &&
              (parent_.get_module()->version() >=
                   SPV_SPIRV_VERSION_WORD(1, 4) ||
               storage_class == spv::StorageClass::Input ||
               storage_class == spv::StorageClass::Output)) {
            used_variables_.insert(*id);
            operands_to_add_.push_back(*id);
          }
        });
    return false;
  }